

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_shr_signed_Test::TestBody(correctness_shr_signed_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_1;
  int in_stack_0000005c;
  big_integer *in_stack_00000060;
  AssertionResult gtest_ar;
  big_integer a;
  big_integer *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  big_integer *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int line;
  big_integer *this_00;
  Type in_stack_fffffffffffffefc;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_f0 [2];
  undefined4 local_d0;
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_50;
  big_integer local_40;
  
  this_00 = &local_40;
  big_integer::big_integer(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  big_integer::big_integer
            (this_00,(big_integer *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  operator>>((big_integer *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  local_d0 = 0xffffff65;
  testing::internal::EqHelper<false>::Compare<big_integer,int>
            ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             &in_stack_fffffffffffffee0->sign,
             (big_integer *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (int *)in_stack_fffffffffffffed0);
  big_integer::~big_integer(in_stack_fffffffffffffed0);
  big_integer::~big_integer(in_stack_fffffffffffffed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff00);
    in_stack_fffffffffffffee0 =
         (big_integer *)testing::AssertionResult::failure_message((AssertionResult *)0x11e1d4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,&this_00->sign,line,
               (char *)in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x11e222);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11e265);
  big_integer::operator>>=(in_stack_00000060,in_stack_0000005c);
  testing::internal::EqHelper<false>::Compare<big_integer,int>
            ((char *)CONCAT44(line,in_stack_fffffffffffffee8),&in_stack_fffffffffffffee0->sign,
             (big_integer *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (int *)in_stack_fffffffffffffed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff00);
    in_stack_fffffffffffffed0 =
         (big_integer *)testing::AssertionResult::failure_message((AssertionResult *)0x11e302);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,&this_00->sign,line,
               &in_stack_fffffffffffffee0->sign);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x11e350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11e390);
  big_integer::~big_integer(in_stack_fffffffffffffed0);
  return;
}

Assistant:

TEST(correctness, shr_signed)
{
    big_integer a = -1234;

    EXPECT_EQ(a >> 3, -155);

    a >>= 3;
    EXPECT_EQ(a, -155);
}